

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33c8f::ParseDummyCommand::configureOutputs
          (ParseDummyCommand *this,ConfigureContext *param_1,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
          *outputs)

{
  pointer ppNVar1;
  int iVar2;
  char *pcVar3;
  Node **node;
  pointer ppNVar4;
  StringRef local_60;
  string local_50;
  
  iVar2 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar2 != '\0') {
    printf("  -- \'outputs\': [");
    ppNVar1 = (outputs->
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = "";
    for (ppNVar4 = (outputs->
                   super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar1;
        ppNVar4 = ppNVar4 + 1) {
      local_60.Data = ((*ppNVar4)->name)._M_dataplus._M_p;
      local_60.Length = ((*ppNVar4)->name)._M_string_length;
      llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
      printf("%s\'%s\'",pcVar3,local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      pcVar3 = ", ";
    }
    puts("]");
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext&,
                                const std::vector<Node*>& outputs) override {
    if (delegate.shouldShowOutput()) {
      bool first = true;
      printf("  -- 'outputs': [");
      for (const auto& node: outputs) {
        printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
        first = false;
      }
      printf("]\n");
    }
  }